

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O3

void __thiscall
iqnet::Reactor<boost::mutex>::invoke_servers_handler
          (Reactor<boost::mutex> *this,Event_handler *handler,HandlerState *hs,bool *terminate)

{
  long lVar1;
  
  lVar1 = 0x18;
  if (((hs->revents & 1U) != 0) || (lVar1 = 0x20, (hs->revents & 2U) != 0)) {
    (**(code **)((long)handler->_vptr_Event_handler + lVar1))(handler,terminate);
  }
  return;
}

Assistant:

void Reactor<Lock>::invoke_servers_handler(
    Event_handler* handler, HandlerState& hs, bool& terminate )
{
  try {
    invoke_clients_handler( handler, hs, terminate );
  }
  catch( const std::exception& e )
  {
    handler->log_exception( e );
    terminate = true;
  }
  catch( ... )
  {
    handler->log_unknown_exception();
    terminate = true;
  }
}